

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

void __thiscall
aeron::archive::AeronArchive::pollNextResponse
          (AeronArchive *this,int64_t correlationId,TimePoint *deadline)

{
  char *pcVar1;
  element_type *peVar2;
  ClientConductor *this_00;
  bool bVar3;
  int iVar4;
  long lVar5;
  SourcedException *this_01;
  char *pcVar6;
  byte *in_RCX;
  nfds_t extraout_RDX;
  nfds_t extraout_RDX_00;
  nfds_t extraout_RDX_01;
  nfds_t __nfds;
  nfds_t extraout_RDX_02;
  ControlResponsePoller *this_02;
  char *pcVar7;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_02 = (ControlResponsePoller *)correlationId;
  iVar4 = ControlResponsePoller::poll
                    ((this->controlResponsePoller_)._M_t.
                     super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                     _M_head_impl,(pollfd *)correlationId,(nfds_t)deadline,(int)in_RCX);
  bVar3 = ControlResponsePoller::isPollComplete
                    ((this->controlResponsePoller_)._M_t.
                     super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                     _M_head_impl);
  __nfds = extraout_RDX;
  do {
    if (bVar3) {
      return;
    }
    if (iVar4 < 1) {
      this_02 = (this->controlResponsePoller_)._M_t.
                super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                ._M_t.
                super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>._M_head_impl;
      ControlResponsePoller::subscription(this_02);
      in_RCX = *(byte **)(local_b0._M_dataplus._M_p + 0x50);
      lVar5 = *(long *)(in_RCX + 8);
      if (lVar5 != 0) {
        in_RCX = (byte *)(*(long *)in_RCX + 0xd0);
        do {
          lVar5 = lVar5 + -1;
          this_02 = (ControlResponsePoller *)CONCAT71((int7)((ulong)this_02 >> 8),*in_RCX);
          if ((*in_RCX & 1) == 0) break;
          in_RCX = in_RCX + 0x128;
        } while (lVar5 != 0);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_string_length);
      }
      lVar5 = std::chrono::_V2::system_clock::now();
      if ((deadline->__d).__r < lVar5) {
        this_01 = (SourcedException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_90,correlationId);
        std::operator+(&local_b0,"awaiting response for correlationId=",&local_90);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,
                   "void aeron::archive::AeronArchive::pollNextResponse(std::int64_t, const TimePoint &)"
                   ,"");
        pcVar7 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
        ;
        pcVar6 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
        do {
          pcVar6 = pcVar6 + 1;
          pcVar1 = pcVar7 + 1;
          pcVar7 = pcVar7 + 1;
        } while (*pcVar6 == *pcVar1);
        std::__cxx11::string::string((string *)&local_50,pcVar7 + (*pcVar1 == '/'),&local_b1);
        aeron::util::SourcedException::SourcedException(this_01,&local_b0,&local_70,&local_50,0x18c)
        ;
        *(undefined ***)this_01 = &PTR__SourcedException_00163260;
        __cxa_throw(this_01,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
      sched_yield();
      peVar2 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      __nfds = extraout_RDX_00;
      if ((peVar2->m_conductorInvoker).m_isRunning == true) {
        this_00 = (peVar2->m_conductorInvoker).m_agent;
        DriverListenerAdapter<aeron::ClientConductor>::receiveMessages
                  (&this_00->m_driverListenerAdapter);
        ClientConductor::onHeartbeatCheckTimeouts(this_00);
        __nfds = extraout_RDX_01;
      }
    }
    iVar4 = ControlResponsePoller::poll
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl,(pollfd *)this_02,__nfds,(int)in_RCX);
    bVar3 = ControlResponsePoller::isPollComplete
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    __nfds = extraout_RDX_02;
  } while( true );
}

Assistant:

void AeronArchive::pollNextResponse(std::int64_t correlationId, const TimePoint& deadline) {
    while (true) {
        std::int32_t fragments = controlResponsePoller_->poll();

        if (controlResponsePoller_->isPollComplete()) {
            break;
        }

        if (fragments > 0) {
            continue;
        }

        if (!controlResponsePoller_->subscription()->isConnected()) {
            throw ArchiveException("subscription to archive is not connected", SOURCEINFO);
        }

        if (Clock::now() > deadline) {
            throw ArchiveException("awaiting response for correlationId=" + std::to_string(correlationId), SOURCEINFO);
        }

        idleStrategy_.idle();
        aeron_->conductorAgentInvoker().invoke();
    }
}